

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O0

iterator * __thiscall
ft::map<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>::insert
          (iterator *__return_storage_ptr__,
          map<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *this,
          iterator *position,value_type *val)

{
  value_type *x;
  bool bVar1;
  pointer x_00;
  reference pvVar2;
  treeNode<ft::pair<const_int,_int>_> *ptVar3;
  node *pnVar4;
  bool local_1e4;
  bool local_1cb;
  bool local_199;
  undefined1 local_168 [16];
  undefined1 local_158 [24];
  iterator local_140;
  undefined1 local_128 [8];
  iterator tmp_1;
  undefined1 local_100 [24];
  iterator local_e8;
  undefined1 local_d0 [8];
  iterator tmp;
  undefined1 local_b0 [16];
  undefined1 local_a0 [24];
  iterator local_88;
  undefined1 local_70 [24];
  pair<ft::treeNode<ft::pair<const_int,_int>_>_*,_bool> ret;
  iterator local_40;
  value_type *local_28;
  value_type *val_local;
  iterator *position_local;
  map<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *this_local;
  
  local_28 = val;
  val_local = (value_type *)position;
  position_local = (iterator *)this;
  this_local = (map<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *)
               __return_storage_ptr__;
  treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
  ::end(&local_40,
        (treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
         *)this);
  bVar1 = operator!=(position,&local_40);
  local_199 = false;
  if (bVar1) {
    x_00 = treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
           ::operator->(position);
    local_199 = mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>::equal
                          (&this->
                            super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                           ,&x_00->first,&local_28->first);
  }
  treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>::
  ~treeIterator(&local_40);
  if (local_199 == false) {
    pair<ft::treeNode<ft::pair<const_int,_int>_>_*,_bool>::pair
              ((pair<ft::treeNode<ft::pair<const_int,_int>_>_*,_bool> *)(local_70 + 0x10));
    bVar1 = treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
            ::empty((treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                     *)this);
    if (bVar1) {
      pnVar4 = treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
               ::root((treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                       *)this);
      BSTinsert((map<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *)local_70,
                (node *)this,&pnVar4->value);
      pair<ft::treeNode<ft::pair<const_int,_int>_>_*,_bool>::operator=
                ((pair<ft::treeNode<ft::pair<const_int,_int>_>_*,_bool> *)(local_70 + 0x10),
                 (pair<ft::treeNode<ft::pair<const_int,_int>_>_*,_bool> *)local_70);
      pair<ft::treeNode<ft::pair<const_int,_int>_>_*,_bool>::~pair
                ((pair<ft::treeNode<ft::pair<const_int,_int>_>_*,_bool> *)local_70);
    }
    else {
      treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
      ::end(&local_88,
            (treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
             *)this);
      bVar1 = operator==(position,&local_88);
      treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
      ::~treeIterator(&local_88);
      if (bVar1) {
        treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
        ::operator--(position);
        mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>::value_comp
                  (&this->
                    super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                  );
        pvVar2 = treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
                 ::operator*(position);
        bVar1 = mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>::
                value_compare::operator()((value_compare *)(local_a0 + 0x17),pvVar2,local_28);
        if (bVar1) {
          ptVar3 = treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
                   ::node(position);
          BSTinsert((map<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *)
                    local_a0,(node *)this,&ptVar3->value);
          pair<ft::treeNode<ft::pair<const_int,_int>_>_*,_bool>::operator=
                    ((pair<ft::treeNode<ft::pair<const_int,_int>_>_*,_bool> *)(local_70 + 0x10),
                     (pair<ft::treeNode<ft::pair<const_int,_int>_>_*,_bool> *)local_a0);
          pair<ft::treeNode<ft::pair<const_int,_int>_>_*,_bool>::~pair
                    ((pair<ft::treeNode<ft::pair<const_int,_int>_>_*,_bool> *)local_a0);
        }
        else {
          pnVar4 = treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                   ::root((treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                           *)this);
          BSTinsert((map<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *)
                    local_b0,(node *)this,&pnVar4->value);
          pair<ft::treeNode<ft::pair<const_int,_int>_>_*,_bool>::operator=
                    ((pair<ft::treeNode<ft::pair<const_int,_int>_>_*,_bool> *)(local_70 + 0x10),
                     (pair<ft::treeNode<ft::pair<const_int,_int>_>_*,_bool> *)local_b0);
          pair<ft::treeNode<ft::pair<const_int,_int>_>_*,_bool>::~pair
                    ((pair<ft::treeNode<ft::pair<const_int,_int>_>_*,_bool> *)local_b0);
        }
      }
      else {
        mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>::value_comp
                  (&this->
                    super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                  );
        pvVar2 = treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
                 ::operator*(position);
        bVar1 = mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>::
                value_compare::operator()((value_compare *)((long)&tmp.m_node + 7),pvVar2,local_28);
        if (bVar1) {
          treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
          ::treeIterator((treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
                          *)local_d0,position);
          treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
          ::operator++((treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
                        *)local_d0);
          treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
          ::end(&local_e8,
                (treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                 *)this);
          bVar1 = operator==((treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
                              *)local_d0,&local_e8);
          local_1cb = true;
          if (!bVar1) {
            mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>::value_comp
                      (&this->
                        super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                      );
            x = local_28;
            pvVar2 = treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
                     ::operator*((treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
                                  *)local_d0);
            local_1cb = mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                        ::value_compare::operator()((value_compare *)(local_100 + 0x17),x,pvVar2);
          }
          treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
          ::~treeIterator(&local_e8);
          if (local_1cb == false) {
            pnVar4 = treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                     ::root((treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                             *)this);
            BSTinsert((map<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *)
                      &tmp_1.m_node,(node *)this,&pnVar4->value);
            pair<ft::treeNode<ft::pair<const_int,_int>_>_*,_bool>::operator=
                      ((pair<ft::treeNode<ft::pair<const_int,_int>_>_*,_bool> *)(local_70 + 0x10),
                       (pair<ft::treeNode<ft::pair<const_int,_int>_>_*,_bool> *)&tmp_1.m_node);
            pair<ft::treeNode<ft::pair<const_int,_int>_>_*,_bool>::~pair
                      ((pair<ft::treeNode<ft::pair<const_int,_int>_>_*,_bool> *)&tmp_1.m_node);
          }
          else {
            ptVar3 = treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
                     ::node(position);
            BSTinsert((map<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *)
                      local_100,(node *)this,&ptVar3->value);
            pair<ft::treeNode<ft::pair<const_int,_int>_>_*,_bool>::operator=
                      ((pair<ft::treeNode<ft::pair<const_int,_int>_>_*,_bool> *)(local_70 + 0x10),
                       (pair<ft::treeNode<ft::pair<const_int,_int>_>_*,_bool> *)local_100);
            pair<ft::treeNode<ft::pair<const_int,_int>_>_*,_bool>::~pair
                      ((pair<ft::treeNode<ft::pair<const_int,_int>_>_*,_bool> *)local_100);
          }
          treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
          ::~treeIterator((treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
                           *)local_d0);
        }
        else {
          treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
          ::treeIterator((treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
                          *)local_128,position);
          treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
          ::operator--((treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
                        *)local_128);
          treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
          ::begin(&local_140,
                  (treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                   *)this);
          bVar1 = operator==(position,&local_140);
          local_1e4 = true;
          if (!bVar1) {
            mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>::value_comp
                      (&this->
                        super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                      );
            pvVar2 = treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
                     ::operator*((treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
                                  *)local_128);
            local_1e4 = mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                        ::value_compare::operator()
                                  ((value_compare *)(local_158 + 0x17),pvVar2,local_28);
          }
          treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
          ::~treeIterator(&local_140);
          if (local_1e4 == false) {
            pnVar4 = treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                     ::root((treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                             *)this);
            BSTinsert((map<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *)
                      local_168,(node *)this,&pnVar4->value);
            pair<ft::treeNode<ft::pair<const_int,_int>_>_*,_bool>::operator=
                      ((pair<ft::treeNode<ft::pair<const_int,_int>_>_*,_bool> *)(local_70 + 0x10),
                       (pair<ft::treeNode<ft::pair<const_int,_int>_>_*,_bool> *)local_168);
            pair<ft::treeNode<ft::pair<const_int,_int>_>_*,_bool>::~pair
                      ((pair<ft::treeNode<ft::pair<const_int,_int>_>_*,_bool> *)local_168);
          }
          else {
            ptVar3 = treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
                     ::node(position);
            BSTinsert((map<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *)
                      local_158,(node *)this,&ptVar3->value);
            pair<ft::treeNode<ft::pair<const_int,_int>_>_*,_bool>::operator=
                      ((pair<ft::treeNode<ft::pair<const_int,_int>_>_*,_bool> *)(local_70 + 0x10),
                       (pair<ft::treeNode<ft::pair<const_int,_int>_>_*,_bool> *)local_158);
            pair<ft::treeNode<ft::pair<const_int,_int>_>_*,_bool>::~pair
                      ((pair<ft::treeNode<ft::pair<const_int,_int>_>_*,_bool> *)local_158);
          }
          treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
          ::~treeIterator((treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
                           *)local_128);
        }
      }
    }
    if (((byte)ret.first & 1) != 0) {
      treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
      ::fixInsertViolation
                ((treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                  *)this,(node *)local_70._16_8_);
      (this->super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
      super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
      .m_size = (this->
                super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
                super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                .m_size + 1;
    }
    treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
    ::treeIterator(__return_storage_ptr__,
                   &(this->
                    super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                    ).
                    super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                    .m_tree,(treeNode<ft::pair<const_int,_int>_> *)local_70._16_8_);
    pair<ft::treeNode<ft::pair<const_int,_int>_>_*,_bool>::~pair
              ((pair<ft::treeNode<ft::pair<const_int,_int>_>_*,_bool> *)(local_70 + 0x10));
  }
  else {
    treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
    ::treeIterator(__return_storage_ptr__,position);
  }
  return __return_storage_ptr__;
}

Assistant:

iterator	insert(iterator position, value_type const & val)
	{
		if (position != this->end() && this->equal(position->first, val.first)) return position;

		ft::pair<node*, bool>	ret;

		if (this->empty())
			ret = this->BSTinsert(this->root(), val);
		else if (position == this->end())
		{
			--position;
			if (this->value_comp()(*position, val))
				ret = this->BSTinsert(position.node(), val);
			else
				ret = this->BSTinsert(this->root(), val);
		}
		else if (this->value_comp()(*position, val))
		{
			iterator	tmp(position);
			++tmp;
			if (tmp == this->end() || this->value_comp()(val, *tmp))
				ret = this->BSTinsert(position.node(), val);
			else
				ret = this->BSTinsert(this->root(), val);
		}
		else
		{
			iterator	tmp(position);
			--tmp;
			if (position == this->begin() || this->value_comp()(*tmp, val))
				ret = this->BSTinsert(position.node(), val);
			else
				ret = this->BSTinsert(this->root(), val);
		}
		if (ret.second)
		{
			this->fixInsertViolation(ret.first);
			++this->m_size;
		}
		return iterator(this->m_tree, ret.first);
	}